

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::ShellCommand::processDependencyInfoDiscoveredDependencies::DepsActions::error
          (DepsActions *this,char *message,uint64_t position)

{
  BuildSystemDelegate *pBVar1;
  allocator local_d9;
  ShellCommand *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pBVar1 = BuildSystem::getDelegate(this->system);
  local_d8 = this->command;
  llvm::StringRef::str_abi_cxx11_(&local_d0,&this->depsPath);
  std::operator+(&local_90,"error reading dependency file \'",&local_d0);
  std::operator+(&local_70,&local_90,"\': ");
  std::__cxx11::string::string((string *)&local_b0,message,&local_d9);
  std::operator+(&local_50,&local_70,&local_b0);
  (*pBVar1->_vptr_BuildSystemDelegate[0xb])
            (pBVar1,local_d8,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  this->numErrors = this->numErrors + 1;
  return;
}

Assistant:

virtual void error(const char* message, uint64_t position) override {
      system.getDelegate().commandHadError(
          command, ("error reading dependency file '" + depsPath.str() +
                    "': " + std::string(message)));
      ++numErrors;
    }